

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsInSubgraph
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWSubgraph *subg)

{
  bool bVar1;
  iterator this_00;
  DefSite *ds_00;
  Offset this_01;
  undefined8 *in_RCX;
  Summary *in_RSI;
  MemorySSATransformation *in_RDI;
  ContainedType *subgblock;
  block_iterator __end3;
  block_iterator __begin3;
  blocks_range *__range3;
  RWNode *subgphi;
  RWNode **it;
  iterator __end5;
  iterator __begin5;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *__range5
  ;
  RWNode *subgphi_1;
  DefSite subgds;
  DiscreteInterval<dg::Offset> *subginterval;
  iterator __end2;
  iterator __begin2;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  *__range2;
  SubgraphInfo *si;
  Summary *summary;
  RWNode *in_stack_fffffffffffffe48;
  MemorySSATransformation *in_stack_fffffffffffffe50;
  Summary *in_stack_fffffffffffffe58;
  RWNode *in_stack_fffffffffffffe60;
  RWNode *in_stack_fffffffffffffe90;
  ModRefInfo *in_stack_fffffffffffffe98;
  iterator local_158;
  RWNode *local_150;
  Offset ds_01;
  Offset OVar2;
  MemorySSATransformation *in_stack_fffffffffffffec8;
  _Self local_118;
  _Self local_110 [2];
  SubgraphInfo *in_stack_ffffffffffffff00;
  RWSubgraph *in_stack_ffffffffffffff08;
  MemorySSATransformation *in_stack_ffffffffffffff10;
  Offset local_c8;
  GenericDefSite<dg::dda::RWNode> local_c0;
  DefSite *ds_02;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
  local_90;
  undefined1 local_88 [24];
  undefined1 *local_70;
  SubgraphInfo *local_38;
  Summary *local_30;
  undefined8 *local_20;
  Summary *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = getSubgraphSummary(in_stack_fffffffffffffe50,(RWSubgraph *)in_stack_fffffffffffffe48);
  local_38 = getSubgraphInfo(in_stack_fffffffffffffe50,(RWSubgraph *)in_stack_fffffffffffffe48);
  computeModRef(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  SubgraphInfo::Summary::getOutputs(in_stack_fffffffffffffe58,(DefSite *)in_stack_fffffffffffffe50);
  RWNode::
  addDefUse<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
            ((RWNode *)in_stack_fffffffffffffe50,
             (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)in_stack_fffffffffffffe48);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
       0x1740ae);
  SubgraphInfo::Summary::getUncoveredOutputs
            (in_stack_fffffffffffffe58,(DefSite *)in_stack_fffffffffffffe50);
  local_70 = local_88;
  local_90._M_current =
       (DiscreteInterval<dg::Offset> *)
       std::
       vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
       ::begin((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                *)in_stack_fffffffffffffe48);
  this_00 = std::
            vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
            ::end((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                   *)in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
                             *)in_stack_fffffffffffffe50,
                            (__normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
                             *)in_stack_fffffffffffffe48), bVar1) {
    ds_00 = (DefSite *)
            __gnu_cxx::
            __normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
            ::operator*(&local_90);
    in_stack_fffffffffffffe60 = (RWNode *)*local_20;
    ds_02 = ds_00;
    local_c8 = ADT::DiscreteInterval<dg::Offset>::length
                         ((DiscreteInterval<dg::Offset> *)in_stack_fffffffffffffe58);
    GenericDefSite<dg::dda::RWNode>::GenericDefSite
              (&local_c0,in_stack_fffffffffffffe60,(Offset *)ds_00,&local_c8);
    bVar1 = ModRefInfo::mayDefine((ModRefInfo *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
    ;
    if (bVar1) {
      this_01.offset =
           (type)createPhi(in_RDI,ds_00,(RWNodeType)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      SubgraphInfo::Summary::addOutput
                ((Summary *)in_stack_fffffffffffffe50,(DefSite *)in_stack_fffffffffffffe48,
                 (RWNode *)0x17438e);
      RWNode::addDefUse((RWNode *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_150 = (RWNode *)RWSubgraph::bblocks((RWSubgraph *)in_stack_fffffffffffffe48);
      ds_01.offset = (type)&local_150;
      local_158._M_current =
           (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
           RWSubgraph::blocks_range::begin((blocks_range *)in_stack_fffffffffffffe48);
      RWSubgraph::blocks_range::end((blocks_range *)in_stack_fffffffffffffe48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                                 *)in_stack_fffffffffffffe50,
                                (__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                                 *)in_stack_fffffffffffffe48), bVar1) {
        in_stack_fffffffffffffe98 =
             (ModRefInfo *)RWSubgraph::block_iterator::operator*((block_iterator *)0x1743fc);
        bVar1 = ElemWithEdges<dg::dda::RWBBlock>::hasSuccessors
                          ((ElemWithEdges<dg::dda::RWBBlock> *)0x17440f);
        if ((!bVar1) &&
           (bVar1 = RWBBlock::isReturnBBlock((RWBBlock *)in_stack_fffffffffffffe48), bVar1)) {
          OVar2.offset = this_01.offset;
          findDefinitions(in_stack_fffffffffffffec8,(RWBBlock *)this_01.offset,
                          (DefSite *)ds_01.offset);
          RWNode::addDefUse<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
                    ((RWNode *)this_01.offset,
                     (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                     in_stack_fffffffffffffe48);
          std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
                    ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                     in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe50 = (MemorySSATransformation *)this_01.offset;
          this_01.offset = OVar2.offset;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
        ::operator++(&local_158);
      }
    }
    else {
      bVar1 = ModRefInfo::mayDefineUnknown((ModRefInfo *)0x1741dc);
      if (bVar1) {
        createPhi(in_RDI,ds_00,(RWNodeType)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        SubgraphInfo::Summary::addOutput
                  ((Summary *)in_stack_fffffffffffffe50,(DefSite *)in_stack_fffffffffffffe48,
                   (RWNode *)0x174221);
        ModRefInfo::getMayDef(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        local_110[0]._M_node =
             (_Base_ptr)
             std::
             set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
             ::begin((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)in_stack_fffffffffffffe48);
        local_118._M_node =
             (_Base_ptr)
             std::
             set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
             ::end((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)in_stack_fffffffffffffe48);
        while (bVar1 = std::operator!=(local_110,&local_118), bVar1) {
          std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator*
                    ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)0x1742c1);
          RWNode::addDefUse((RWNode *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator++
                    ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)in_stack_fffffffffffffe50);
        }
        in_stack_ffffffffffffff64 = 4;
        std::
        set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
        ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)0x1742b2);
        RWNode::addDefUse((RWNode *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      in_stack_fffffffffffffe58 = local_10;
      findDefinitions((MemorySSATransformation *)this_00._M_current,
                      (RWNode *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),ds_02)
      ;
      RWNode::addDefUse<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
                ((RWNode *)in_stack_fffffffffffffe50,
                 (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                 in_stack_fffffffffffffe48);
      std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
                ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                 in_stack_fffffffffffffe60);
    }
    __gnu_cxx::
    __normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
    ::operator++(&local_90);
  }
  std::
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ::~vector((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
             *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsInSubgraph(RWNode *phi,
                                                        RWNodeCall *C,
                                                        const DefSite &ds,
                                                        RWSubgraph *subg) {
    DBG_SECTION_BEGIN(tmp,
                      "Searching definitions in subgraph " << subg->getName());
    auto &summary = getSubgraphSummary(subg);
    auto &si = getSubgraphInfo(subg);
    computeModRef(subg, si);
    assert(si.modref.isInitialized());

    // Add the definitions that we have found in previous exploration
    phi->addDefUse(summary.getOutputs(ds));

    // search the definitions that we have not found yet
    for (auto &subginterval : summary.getUncoveredOutputs(ds)) {
        // we must create a new phi for each subgraph inside the subgraph
        // (these phis will be merged by the single 'phi').
        // Of course, we create them only when not already present.
        auto subgds =
                DefSite{ds.target, subginterval.start, subginterval.length()};

        // do not search the procedure if it cannot define the memory
        // (this saves creating PHI nodes). If it may define only
        // unknown memory, add that definitions directly and continue searching
        // before the call.
        if (!si.modref.mayDefine(ds.target)) {
            if (si.modref.mayDefineUnknown()) {
                auto *subgphi =
                        createPhi(subgds, /* type = */ RWNodeType::OUTARG);
                summary.addOutput(subgds, subgphi);
                for (const auto &it : si.modref.getMayDef(UNKNOWN_MEMORY)) {
                    subgphi->addDefUse(it);
                }
                phi->addDefUse(subgphi);
            }
            // continue the search before the call
            phi->addDefUse(findDefinitions(C, subgds));
            continue;
        }

        auto *subgphi = createPhi(subgds, /* type = */ RWNodeType::OUTARG);
        summary.addOutput(subgds, subgphi);
        phi->addDefUse(subgphi);

        // find the new phi operands
        for (auto *subgblock : subg->bblocks()) {
            if (subgblock->hasSuccessors()) {
                continue;
            }
            if (!subgblock->isReturnBBlock()) {
                // ignore blocks that does not return to this subgraph
                continue;
            }
            subgphi->addDefUse(findDefinitions(subgblock, ds));
        }
    }
    DBG_SECTION_END(tmp, "Done searching definitions in subgraph "
                                 << subg->getName());
}